

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O3

void TPZFMatrix<long_double>::MultAdd
               (longdouble *ptr,int64_t rows,int64_t cols,TPZFMatrix<long_double> *x,
               TPZFMatrix<long_double> *y,TPZFMatrix<long_double> *z,longdouble alpha,
               longdouble beta,int opt)

{
  longdouble lVar1;
  long lVar2;
  long lVar3;
  longdouble *plVar4;
  bool bVar5;
  ulong uVar6;
  size_t sVar7;
  longdouble *plVar8;
  long lVar9;
  char *msg1;
  longdouble *plVar10;
  longdouble *plVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  longdouble lVar15;
  long local_68;
  
  lVar2 = (x->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow;
  if (opt == 0) {
    if (lVar2 == cols) {
      lVar15 = (longdouble)0;
      bVar5 = beta != lVar15;
      if (((beta == lVar15) && (!NAN(beta) && !NAN(lVar15))) ||
         ((msg1 = "TPZFMatrix::MultAdd matrix y with incompatible dimensions>",
          (y->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow == rows &&
          ((y->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol ==
           (x->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol)))) {
        uVar6 = rows;
        if (((z->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol !=
             (x->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol) ||
           ((z->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow != rows)) {
          (*(z->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0xe])(z);
        }
        goto LAB_00bdf278;
      }
      goto LAB_00bdf238;
    }
  }
  else if (lVar2 == rows) {
    if ((beta != (longdouble)0) || (NAN(beta) || NAN((longdouble)0))) {
      msg1 = "TPZFMatrix::MultAdd matrix y with incompatible dimensions>";
      if (((y->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow != cols) ||
         (bVar5 = true,
         (y->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol !=
         (x->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol)) goto LAB_00bdf238;
    }
    else {
      bVar5 = false;
    }
    uVar6 = cols;
    if (((z->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol !=
         (x->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol) ||
       ((z->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow != cols)) {
      (*(z->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xe]
      )(z);
    }
LAB_00bdf278:
    if ((cols != 0 && rows != 0) &&
       (lVar2 = (x->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol, 0 < lVar2)) {
      uVar6 = uVar6 & 0xffffffff;
      local_68 = 0;
      lVar14 = 0;
      do {
        lVar3 = (z->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow;
        if ((lVar3 < 1) || ((z->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol <= lVar14)) {
          Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        plVar4 = z->fElem;
        if (bVar5) {
          if (z != y) {
            memcpy(plVar4 + lVar3 * lVar14,
                   y->fElem + (y->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow * lVar14,
                   uVar6 << 4);
          }
          if (uVar6 != 0) {
            uVar12 = 0;
            do {
              lVar3 = (z->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow;
              lVar13 = 0;
              do {
                if ((lVar3 <= (long)uVar12) ||
                   ((z->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol <= lVar13)) {
                  Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                lVar9 = lVar3 * lVar13;
                z->fElem[lVar9 + uVar12] = beta * z->fElem[lVar9 + uVar12];
                lVar13 = lVar13 + 1;
              } while (lVar2 != lVar13);
              uVar12 = uVar12 + 1;
            } while (uVar12 != uVar6);
          }
        }
        else if (uVar6 != 0) {
          sVar7 = 0;
          do {
            *(longdouble *)((long)plVar4 + sVar7 + lVar3 * local_68) = (longdouble)0;
            sVar7 = sVar7 + 0x10;
          } while (uVar6 << 4 != sVar7);
        }
        lVar14 = lVar14 + 1;
        local_68 = local_68 + 0x10;
      } while (lVar14 != lVar2);
      if (0 < lVar2) {
        lVar14 = 0;
        do {
          if (opt == 0) {
            if (0 < cols) {
              lVar3 = (z->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow;
              lVar13 = 0;
              do {
                if ((lVar3 < 1) ||
                   ((z->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol <= lVar14)) {
                  Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                if (0 < rows) {
                  plVar8 = z->fElem + lVar3 * lVar14;
                  lVar9 = (x->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow;
                  plVar10 = x->fElem;
                  plVar4 = plVar8 + rows;
                  plVar11 = ptr + lVar13 * rows;
                  do {
                    lVar15 = *plVar11;
                    plVar11 = plVar11 + 1;
                    *plVar8 = *plVar8 + plVar10[lVar9 * lVar14 + lVar13] * lVar15 * alpha;
                    plVar8 = plVar8 + 1;
                  } while (plVar8 < plVar4);
                }
                lVar13 = lVar13 + 1;
              } while (lVar13 != cols);
            }
          }
          else {
            lVar3 = (z->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow;
            if ((lVar3 < 1) ||
               ((z->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol <= lVar14)) {
              Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if (0 < cols) {
              plVar8 = z->fElem + lVar3 * lVar14;
              lVar3 = (x->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow;
              plVar4 = x->fElem;
              lVar13 = 0;
              plVar10 = ptr;
              do {
                if (rows < 1) {
                  lVar15 = (longdouble)0;
                }
                else {
                  lVar15 = (longdouble)0;
                  plVar11 = plVar4 + lVar3 * lVar14;
                  do {
                    lVar1 = *plVar10;
                    plVar10 = plVar10 + 1;
                    lVar15 = *plVar11 * lVar1 + lVar15;
                    plVar11 = plVar11 + 1;
                  } while (plVar11 < plVar4 + lVar3 * lVar14 + rows);
                }
                *plVar8 = *plVar8 + alpha * lVar15;
                plVar8 = plVar8 + 1;
                lVar13 = lVar13 + 1;
              } while (lVar13 != cols);
            }
          }
          lVar14 = lVar14 + 1;
        } while (lVar14 != lVar2);
      }
    }
    return;
  }
  msg1 = "TPZFMatrix::MultAdd matrix x with incompatible dimensions>";
LAB_00bdf238:
  Error(msg1,(char *)0x0);
  return;
}

Assistant:

void TPZFMatrix<TVar>::MultAdd(const TVar *ptr, int64_t rows, int64_t cols, const TPZFMatrix<TVar> &x,const TPZFMatrix<TVar> &y, TPZFMatrix<TVar> &z,
                               const TVar alpha,const TVar beta ,const int opt)
{
    
    
    if ((!opt && cols != x.Rows()) || (opt && rows != x.Rows())) {
        Error( "TPZFMatrix::MultAdd matrix x with incompatible dimensions>" );
        return;
    }
    if(beta != (TVar)0. && ((!opt && rows != y.Rows()) || (opt && cols != y.Rows()) || y.Cols() != x.Cols())) {
        Error( "TPZFMatrix::MultAdd matrix y with incompatible dimensions>" );
        return;
    }
    if(!opt) {
        if(z.Cols() != x.Cols() || z.Rows() != rows) {
            z.Redim(rows,x.Cols());
        }
    } else {
        if(z.Cols() != x.Cols() || z.Rows() != cols) {
            z.Redim(cols,x.Cols());
        }
    }
    unsigned numeq = opt ? cols : rows;
    int64_t xcols = x.Cols();
    int64_t ic, c;
    if(!(rows*cols)) return;
    for (ic = 0; ic < xcols; ic++) {
        TVar *zp = &z(0,ic), *zlast = zp+numeq;
        if(beta != (TVar)0.) {
            const TVar *yp = &y.g(0,ic);
            if(&z != &y) {
                memcpy((void *)zp,(void *)yp,numeq*sizeof(TVar));
            }
            for(int64_t i=0; i< numeq; i++) for(int64_t c=0; c<xcols; c++) z(i,c) *= beta;
        } else {
            while(zp != zlast) {
                *zp = 0.;
                zp ++;
            }
        }
    }
    
    
    for (ic = 0; ic < xcols; ic++) {
        if(!opt) {
            for ( c = 0; c<cols; c++) {
                TVar * zp = &z(0,ic), *zlast = zp+rows;
                const TVar * fp = ptr +rows*c;
                const TVar * xp = &x.g(c,ic);
                while(zp < zlast) {
                    *zp += alpha* *fp++ * *xp;
                    zp ++;
                }
            }
        } else {
            const TVar * fp = ptr;
            TVar *zp = &z(0,ic);
            for (c = 0; c<cols; c++) {
                TVar val = 0.;
                // bug correction philippe 5/2/97
                //					 REAL * xp = &x(0,ic), xlast = xp + numeq;
                const TVar *xp = &x.g(0,ic);
                const TVar *xlast = xp + rows;
                while(xp < xlast) {
                    val += *fp++ * *xp;
                    xp ++;
                }
                *zp += alpha *val;
                zp ++;
            }
        }
    }
    
    
    
    
    
}